

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_CheckAddressNetType_bitcoin_Test::TestBody
          (AddressFactory_CheckAddressNetType_bitcoin_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  bool bVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  char *pcVar15;
  char *in_R9;
  AssertionResult gtest_ar__83;
  AssertionResult gtest_ar__82;
  AssertionResult gtest_ar__81;
  AssertionResult gtest_ar__80;
  AssertionResult gtest_ar__79;
  AssertionResult gtest_ar__78;
  AssertionResult gtest_ar__77;
  AssertionResult gtest_ar__76;
  AssertionResult gtest_ar__75;
  AssertionResult gtest_ar__74;
  AssertionResult gtest_ar__73;
  AssertionResult gtest_ar__72;
  AssertionResult gtest_ar__71;
  AssertionResult gtest_ar__70;
  AssertionResult gtest_ar__69;
  AssertionResult gtest_ar__68;
  AssertionResult gtest_ar__67;
  AssertionResult gtest_ar__66;
  AssertionResult gtest_ar__65;
  AssertionResult gtest_ar__64;
  AssertionResult gtest_ar__63;
  AssertionResult gtest_ar__62;
  AssertionResult gtest_ar__61;
  AssertionResult gtest_ar__60;
  AssertionResult gtest_ar__59;
  AssertionResult gtest_ar__58;
  AssertionResult gtest_ar__57;
  AssertionResult gtest_ar__56;
  AssertionResult gtest_ar__55;
  AssertionResult gtest_ar__54;
  AssertionResult gtest_ar__53;
  AssertionResult gtest_ar__52;
  AssertionResult gtest_ar__51;
  AssertionResult gtest_ar__50;
  AssertionResult gtest_ar__49;
  AssertionResult gtest_ar__48;
  AssertionResult gtest_ar__47;
  AssertionResult gtest_ar__46;
  AssertionResult gtest_ar__45;
  AssertionResult gtest_ar__44;
  AssertionResult gtest_ar__43;
  AssertionResult gtest_ar__42;
  AssertionResult gtest_ar__41;
  AssertionResult gtest_ar__40;
  AssertionResult gtest_ar__39;
  AssertionResult gtest_ar__38;
  AssertionResult gtest_ar__37;
  AssertionResult gtest_ar__36;
  AssertionResult gtest_ar__35;
  AssertionResult gtest_ar__34;
  AssertionResult gtest_ar__33;
  AssertionResult gtest_ar__32;
  AssertionResult gtest_ar__31;
  AssertionResult gtest_ar__30;
  AssertionResult gtest_ar__29;
  AssertionResult gtest_ar__28;
  AssertionResult gtest_ar__27;
  AssertionResult gtest_ar__26;
  AssertionResult gtest_ar__25;
  AssertionResult gtest_ar__24;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar__14;
  Script script;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Address addr;
  Pubkey pubkey;
  AddressFactory factory;
  undefined4 in_stack_ffffffffffffd228;
  NetType in_stack_ffffffffffffd22c;
  undefined1 in_stack_ffffffffffffd230;
  undefined1 in_stack_ffffffffffffd231;
  undefined1 in_stack_ffffffffffffd232;
  undefined1 in_stack_ffffffffffffd233;
  undefined1 in_stack_ffffffffffffd234;
  undefined1 in_stack_ffffffffffffd235;
  undefined1 in_stack_ffffffffffffd236;
  undefined1 in_stack_ffffffffffffd237;
  undefined1 in_stack_ffffffffffffd238;
  undefined1 in_stack_ffffffffffffd239;
  undefined1 in_stack_ffffffffffffd23a;
  undefined1 in_stack_ffffffffffffd23b;
  undefined1 in_stack_ffffffffffffd23c;
  undefined1 in_stack_ffffffffffffd23d;
  undefined1 in_stack_ffffffffffffd23e;
  undefined1 in_stack_ffffffffffffd23f;
  undefined1 in_stack_ffffffffffffd240;
  undefined1 in_stack_ffffffffffffd241;
  undefined1 in_stack_ffffffffffffd242;
  undefined1 in_stack_ffffffffffffd243;
  undefined1 in_stack_ffffffffffffd244;
  undefined1 in_stack_ffffffffffffd245;
  undefined1 in_stack_ffffffffffffd246;
  undefined1 in_stack_ffffffffffffd247;
  NetType in_stack_ffffffffffffd2ec;
  undefined4 uVar16;
  undefined3 uVar18;
  NetType NVar17;
  undefined1 in_stack_ffffffffffffd2f0;
  undefined1 in_stack_ffffffffffffd2f1;
  undefined1 in_stack_ffffffffffffd2f2;
  undefined1 in_stack_ffffffffffffd2f3;
  undefined1 in_stack_ffffffffffffd2f4;
  undefined1 in_stack_ffffffffffffd2f5;
  undefined1 in_stack_ffffffffffffd2f6;
  AddressFactory *this_00;
  string local_2cf8;
  AssertHelper local_2cd8;
  Message local_2cd0;
  byte local_2cc1;
  AssertionResult local_2cc0;
  string local_2cb0;
  AssertHelper local_2c90;
  Message local_2c88;
  byte local_2c79;
  AssertionResult local_2c78;
  string local_2c68;
  AssertHelper local_2c48;
  Message local_2c40;
  byte local_2c31;
  AssertionResult local_2c30;
  string local_2c20;
  AssertHelper local_2c00;
  Message local_2bf8;
  byte local_2be9;
  AssertionResult local_2be8;
  string local_2bd8;
  AssertHelper local_2bb8;
  Message local_2bb0;
  undefined1 local_2ba1;
  AssertionResult local_2ba0;
  string local_2b90;
  AssertHelper local_2b70;
  Message local_2b68;
  byte local_2b59;
  AssertionResult local_2b58;
  string local_2b48;
  AssertHelper local_2b28;
  Message local_2b20;
  byte local_2b11;
  AssertionResult local_2b10;
  AssertHelper local_2b00;
  Message local_2af8;
  Address local_2af0;
  string local_2978;
  AssertHelper local_2958;
  Message local_2950;
  byte local_2941;
  AssertionResult local_2940;
  string local_2930;
  AssertHelper local_2910;
  Message local_2908;
  byte local_28f9;
  AssertionResult local_28f8;
  string local_28e8;
  AssertHelper local_28c8;
  Message local_28c0;
  byte local_28b1;
  AssertionResult local_28b0;
  string local_28a0;
  AssertHelper local_2880;
  Message local_2878;
  byte local_2869;
  AssertionResult local_2868;
  string local_2858;
  AssertHelper local_2838;
  Message local_2830;
  undefined1 local_2821;
  AssertionResult local_2820;
  string local_2810;
  AssertHelper local_27f0;
  Message local_27e8;
  undefined1 local_27d9;
  AssertionResult local_27d8;
  string local_27c8;
  AssertHelper local_27a8;
  Message local_27a0;
  byte local_2791;
  AssertionResult local_2790;
  AssertHelper local_2780;
  Message local_2778;
  Address local_2770;
  string local_25f8;
  AssertHelper local_25d8;
  Message local_25d0;
  byte local_25c1;
  AssertionResult local_25c0;
  string local_25b0;
  AssertHelper local_2590;
  Message local_2588;
  byte local_2579;
  AssertionResult local_2578;
  string local_2568;
  AssertHelper local_2548;
  Message local_2540;
  byte local_2531;
  AssertionResult local_2530;
  string local_2520;
  AssertHelper local_2500;
  Message local_24f8;
  byte local_24e9;
  AssertionResult local_24e8;
  string local_24d8;
  AssertHelper local_24b8;
  Message local_24b0;
  undefined1 local_24a1;
  AssertionResult local_24a0;
  string local_2490;
  AssertHelper local_2470;
  Message local_2468;
  byte local_2459;
  AssertionResult local_2458;
  string local_2448;
  AssertHelper local_2428;
  Message local_2420;
  byte local_2411;
  AssertionResult local_2410;
  AssertHelper local_2400;
  Message local_23f8;
  Address local_23f0;
  string local_2278;
  AssertHelper local_2258;
  Message local_2250;
  byte local_2241;
  AssertionResult local_2240;
  string local_2230;
  AssertHelper local_2210;
  Message local_2208;
  byte local_21f9;
  AssertionResult local_21f8;
  string local_21e8;
  AssertHelper local_21c8;
  Message local_21c0;
  byte local_21b1;
  AssertionResult local_21b0;
  string local_21a0;
  AssertHelper local_2180;
  Message local_2178;
  byte local_2169;
  AssertionResult local_2168;
  string local_2158;
  AssertHelper local_2138;
  Message local_2130;
  undefined1 local_2121;
  AssertionResult local_2120;
  string local_2110;
  AssertHelper local_20f0;
  Message local_20e8;
  undefined1 local_20d9;
  AssertionResult local_20d8;
  string local_20c8;
  AssertHelper local_20a8;
  Message local_20a0;
  byte local_2091;
  AssertionResult local_2090;
  AssertHelper local_2080;
  Message local_2078;
  Address local_2070;
  string local_1eb8;
  AssertHelper local_1e98;
  Message local_1e90;
  byte local_1e81;
  AssertionResult local_1e80;
  string local_1e70;
  AssertHelper local_1e50;
  Message local_1e48;
  byte local_1e39;
  AssertionResult local_1e38;
  string local_1e28;
  AssertHelper local_1e08;
  Message local_1e00;
  byte local_1df1;
  AssertionResult local_1df0;
  string local_1de0;
  AssertHelper local_1dc0;
  Message local_1db8;
  byte local_1da9;
  AssertionResult local_1da8;
  string local_1d98;
  AssertHelper local_1d78;
  Message local_1d70;
  byte local_1d61;
  AssertionResult local_1d60;
  string local_1d50;
  AssertHelper local_1d30;
  Message local_1d28;
  undefined1 local_1d19;
  AssertionResult local_1d18;
  string local_1d08;
  AssertHelper local_1ce8;
  Message local_1ce0;
  byte local_1cd1;
  AssertionResult local_1cd0;
  AssertHelper local_1cc0;
  Message local_1cb8;
  Address local_1cb0;
  string local_1b38;
  AssertHelper local_1b18;
  Message local_1b10;
  byte local_1b01;
  AssertionResult local_1b00;
  string local_1af0;
  AssertHelper local_1ad0;
  Message local_1ac8;
  byte local_1ab9;
  AssertionResult local_1ab8;
  string local_1aa8;
  AssertHelper local_1a88;
  Message local_1a80;
  byte local_1a71;
  AssertionResult local_1a70;
  string local_1a60;
  AssertHelper local_1a40;
  Message local_1a38;
  byte local_1a29;
  AssertionResult local_1a28;
  string local_1a18;
  AssertHelper local_19f8;
  Message local_19f0;
  undefined1 local_19e1;
  AssertionResult local_19e0;
  string local_19d0;
  AssertHelper local_19b0;
  Message local_19a8;
  undefined1 local_1999;
  AssertionResult local_1998;
  string local_1988;
  AssertHelper local_1968;
  Message local_1960;
  byte local_1951;
  AssertionResult local_1950;
  AssertHelper local_1940;
  Message local_1938;
  Address local_1930;
  string local_17b8;
  AssertHelper local_1798;
  Message local_1790;
  byte local_1781;
  AssertionResult local_1780;
  string local_1770;
  AssertHelper local_1750;
  Message local_1748;
  byte local_1739;
  AssertionResult local_1738;
  string local_1728;
  AssertHelper local_1708;
  Message local_1700;
  byte local_16f1;
  AssertionResult local_16f0;
  string local_16e0;
  AssertHelper local_16c0;
  Message local_16b8;
  byte local_16a9;
  AssertionResult local_16a8;
  string local_1698;
  AssertHelper local_1678;
  Message local_1670;
  byte local_1661;
  AssertionResult local_1660;
  string local_1650;
  AssertHelper local_1630;
  Message local_1628;
  undefined1 local_1619;
  AssertionResult local_1618;
  string local_1608;
  AssertHelper local_15e8;
  Message local_15e0;
  byte local_15d1;
  AssertionResult local_15d0;
  AssertHelper local_15c0;
  Message local_15b8;
  Address local_15b0;
  string local_1438;
  AssertHelper local_1418;
  Message local_1410;
  byte local_1401;
  AssertionResult local_1400;
  string local_13f0;
  AssertHelper local_13d0;
  Message local_13c8;
  byte local_13b9;
  AssertionResult local_13b8;
  string local_13a8;
  AssertHelper local_1388;
  Message local_1380;
  byte local_1371;
  AssertionResult local_1370;
  string local_1360;
  AssertHelper local_1340;
  Message local_1338;
  byte local_1329;
  AssertionResult local_1328;
  string local_1318;
  AssertHelper local_12f8;
  Message local_12f0;
  undefined1 local_12e1;
  AssertionResult local_12e0;
  string local_12d0;
  AssertHelper local_12b0;
  Message local_12a8;
  undefined1 local_1299;
  AssertionResult local_1298;
  string local_1288;
  AssertHelper local_1268;
  Message local_1260;
  byte local_1251;
  AssertionResult local_1250;
  AssertHelper local_1240;
  Message local_1238;
  Address local_1230;
  string local_1078;
  AssertHelper local_1058;
  Message local_1050;
  byte local_1041;
  AssertionResult local_1040;
  string local_1030;
  AssertHelper local_1010;
  Message local_1008;
  byte local_ff9;
  AssertionResult local_ff8;
  string local_fe8;
  AssertHelper local_fc8;
  Message local_fc0;
  byte local_fb1;
  AssertionResult local_fb0;
  string local_fa0;
  AssertHelper local_f80;
  Message local_f78;
  byte local_f69;
  AssertionResult local_f68;
  string local_f58;
  AssertHelper local_f38;
  Message local_f30;
  byte local_f21;
  AssertionResult local_f20;
  string local_f10;
  AssertHelper local_ef0;
  Message local_ee8;
  byte local_ed9;
  AssertionResult local_ed8;
  string local_ec8;
  AssertHelper local_ea8;
  Message local_ea0;
  undefined1 local_e91;
  AssertionResult local_e90;
  AssertHelper local_e80;
  Message local_e78;
  Address local_e70;
  string local_cf8;
  AssertHelper local_cd8;
  Message local_cd0;
  byte local_cc1;
  AssertionResult local_cc0;
  string local_cb0;
  AssertHelper local_c90;
  Message local_c88;
  byte local_c79;
  AssertionResult local_c78;
  string local_c68;
  AssertHelper local_c48;
  Message local_c40;
  byte local_c31;
  AssertionResult local_c30;
  string local_c20;
  AssertHelper local_c00;
  Message local_bf8;
  byte local_be9;
  AssertionResult local_be8;
  string local_bd8;
  AssertHelper local_bb8;
  Message local_bb0;
  byte local_ba1;
  AssertionResult local_ba0;
  string local_b90;
  AssertHelper local_b70;
  Message local_b68;
  byte local_b59;
  AssertionResult local_b58;
  string local_b48;
  AssertHelper local_b28;
  Message local_b20;
  undefined1 local_b11;
  AssertionResult local_b10;
  AssertHelper local_b00;
  Message local_af8;
  Address local_af0;
  allocator local_971;
  string local_970;
  Script local_950;
  string local_918;
  AssertHelper local_8f8;
  Message local_8f0;
  byte local_8e1;
  AssertionResult local_8e0;
  string local_8d0;
  AssertHelper local_8b0;
  Message local_8a8;
  byte local_899;
  AssertionResult local_898;
  string local_888;
  AssertHelper local_868;
  Message local_860;
  byte local_851;
  AssertionResult local_850;
  string local_840;
  AssertHelper local_820;
  Message local_818;
  byte local_809;
  AssertionResult local_808;
  string local_7f8;
  AssertHelper local_7d8;
  Message local_7d0;
  byte local_7c1;
  AssertionResult local_7c0;
  string local_7b0;
  AssertHelper local_790;
  Message local_788;
  byte local_779;
  AssertionResult local_778;
  string local_768;
  AssertHelper local_748;
  Message local_740;
  undefined1 local_731;
  AssertionResult local_730;
  AssertHelper local_720;
  Message local_718;
  Address local_710;
  string local_598;
  AssertHelper local_578;
  Message local_570;
  byte local_561;
  AssertionResult local_560;
  string local_550;
  AssertHelper local_530;
  Message local_528;
  byte local_519;
  AssertionResult local_518;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  byte local_4d1;
  AssertionResult local_4d0;
  string local_4c0;
  AssertHelper local_4a0;
  Message local_498;
  byte local_489;
  AssertionResult local_488;
  string local_478;
  AssertHelper local_458;
  Message local_450;
  byte local_441;
  AssertionResult local_440;
  string local_430;
  AssertHelper local_410;
  Message local_408;
  byte local_3f9;
  AssertionResult local_3f8;
  string local_3e8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined1 local_3b1;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398 [2];
  Address local_388;
  Address local_210;
  AddressFactory local_91 [3];
  
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             in_stack_ffffffffffffd22c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1ccf8b);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffd247,
                      CONCAT16(in_stack_ffffffffffffd246,
                               CONCAT15(in_stack_ffffffffffffd245,
                                        CONCAT14(in_stack_ffffffffffffd244,
                                                 CONCAT13(in_stack_ffffffffffffd243,
                                                          CONCAT12(in_stack_ffffffffffffd242,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd241,
                                                  in_stack_ffffffffffffd240))))))));
  this_00 = local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_91[0]._vptr_AddressFactory + 1),
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             (allocator *)this_00);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             ((long)&local_91[0].prefix_list_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
             (string *)((long)&local_91[0]._vptr_AddressFactory + 1));
  std::__cxx11::string::~string((string *)((long)&local_91[0]._vptr_AddressFactory + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  cfd::core::Address::Address(&local_210);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    in_stack_ffffffffffffd2f6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffd2f6) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_388);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(local_398);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x150,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message((Message *)0x1cd1fa);
  }
  uVar2 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(in_stack_ffffffffffffd2f5,
                                                              CONCAT14(in_stack_ffffffffffffd2f4,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffd2f3,
                                                  CONCAT12(in_stack_ffffffffffffd2f2,
                                                           CONCAT11(in_stack_ffffffffffffd2f1,
                                                                    in_stack_ffffffffffffd2f0)))))))
                     ,in_stack_ffffffffffffd2ec);
  local_3b1 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cd28e)
  ;
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e8,(internal *)&local_3b0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x151,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    testing::Message::~Message((Message *)0x1cd37a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cd3f5);
  uVar4 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  in_stack_ffffffffffffd2f3,
                                                  CONCAT12(in_stack_ffffffffffffd2f2,
                                                           CONCAT11(in_stack_ffffffffffffd2f1,
                                                                    in_stack_ffffffffffffd2f0)))))))
                     ,in_stack_ffffffffffffd2ec);
  local_3f9 = ~uVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cd443)
  ;
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_430,(internal *)&local_3f8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x152,pcVar15);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    testing::Message::~Message((Message *)0x1cd541);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cd5bc);
  uVar6 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(in_stack_ffffffffffffd2f1,
                                                                          in_stack_ffffffffffffd2f0)
                                                          )))))),in_stack_ffffffffffffd2ec);
  local_441 = ~uVar6 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cd60a)
  ;
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_440);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_440,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x153,pcVar15);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    testing::Message::~Message((Message *)0x1cd708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cd783);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                     in_stack_ffffffffffffd2ec);
  uVar16 = CONCAT13(bVar8,(int3)in_stack_ffffffffffffd2ec);
  local_489 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cd7d1)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  NVar17 = CONCAT13((char)((uint)uVar16 >> 0x18),CONCAT12(bVar8,(short)uVar16));
  if (!bVar8) {
    testing::Message::Message(&local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4c0,(internal *)&local_488,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x154,pcVar15);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    testing::Message::~Message((Message *)0x1cd8cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cd94a);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  uVar18 = CONCAT21((short)(NVar17 >> 0x10),bVar8);
  local_4d1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cd998)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  NVar17 = CONCAT31(uVar18,bVar8);
  if (!bVar8) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_508,(internal *)&local_4d0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x155,pcVar15);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    testing::Message::~Message((Message *)0x1cda96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cdb11);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_519 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cdb5f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_518);
  if (!bVar8) {
    testing::Message::Message(&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_550,(internal *)&local_518,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x156,pcVar15);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    testing::Message::~Message((Message *)0x1cdc5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cdcd8);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_561 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cdd26)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar8) {
    testing::Message::Message(&local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_598,(internal *)&local_560,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x157,pcVar15);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    testing::Message::~Message((Message *)0x1cde24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cde9f);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_710);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_718);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x159,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    testing::Message::~Message((Message *)0x1cdffa);
  }
  local_731 = cfd::AddressFactory::CheckAddressNetType
                        (this_00,(Address *)
                                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                         CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                         NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce08e)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_730);
  if (!bVar8) {
    testing::Message::Message(&local_740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_768,(internal *)&local_730,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    testing::Message::~Message((Message *)0x1ce17a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce1f5);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_779 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce243)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar8) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7b0,(internal *)&local_778,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15b,pcVar15);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
    testing::Message::~Message((Message *)0x1ce341);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce3bc);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_7c1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce40a)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_7c0);
  if (!bVar8) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f8,(internal *)&local_7c0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    testing::Message::~Message((Message *)0x1ce508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce583);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_809 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce5d1)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_808);
  if (!bVar8) {
    testing::Message::Message(&local_818);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_840,(internal *)&local_808,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    testing::Message::~Message((Message *)0x1ce6cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce74a);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_851 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce798)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_850);
  if (!bVar8) {
    testing::Message::Message(&local_860);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_888,(internal *)&local_850,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    std::__cxx11::string::~string((string *)&local_888);
    testing::Message::~Message((Message *)0x1ce896);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce911);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_899 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ce95f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar8) {
    testing::Message::Message(&local_8a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8d0,(internal *)&local_898,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x15f,pcVar15);
    testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    std::__cxx11::string::~string((string *)&local_8d0);
    testing::Message::~Message((Message *)0x1cea5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cead8);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_8e1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1ceb26)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar8) {
    testing::Message::Message(&local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_918,(internal *)&local_8e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x160,pcVar15);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    testing::Message::~Message((Message *)0x1cec24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cec9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_970,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",&local_971);
  cfd::core::Script::Script(&local_950,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_af0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_af8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x163,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b00,&local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    testing::Message::~Message((Message *)0x1ceec3);
  }
  local_b11 = cfd::AddressFactory::CheckAddressNetType
                        (this_00,(Address *)
                                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                         CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                         NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cef57)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_b10);
  if (!bVar8) {
    testing::Message::Message(&local_b20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b48,(internal *)&local_b10,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x164,pcVar15);
    testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
    testing::internal::AssertHelper::~AssertHelper(&local_b28);
    std::__cxx11::string::~string((string *)&local_b48);
    testing::Message::~Message((Message *)0x1cf043);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf0be);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_b59 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf10c)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_b58);
  if (!bVar8) {
    testing::Message::Message(&local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b90,(internal *)&local_b58,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x165,pcVar15);
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    std::__cxx11::string::~string((string *)&local_b90);
    testing::Message::~Message((Message *)0x1cf20a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf285);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_ba1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf2d3)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_ba0);
  if (!bVar8) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bd8,(internal *)&local_ba0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x166,pcVar15);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&local_bd8);
    testing::Message::~Message((Message *)0x1cf3d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf44c);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_be9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf49a)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_be8);
  if (!bVar8) {
    testing::Message::Message(&local_bf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c20,(internal *)&local_be8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x167,pcVar15);
    testing::internal::AssertHelper::operator=(&local_c00,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper(&local_c00);
    std::__cxx11::string::~string((string *)&local_c20);
    testing::Message::~Message((Message *)0x1cf598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf613);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_c31 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf661)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
  if (!bVar8) {
    testing::Message::Message(&local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c68,(internal *)&local_c30,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x168,pcVar15);
    testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)&local_c68);
    testing::Message::~Message((Message *)0x1cf75f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf7da);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_c79 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf828)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_c78);
  if (!bVar8) {
    testing::Message::Message(&local_c88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cb0,(internal *)&local_c78,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x169,pcVar15);
    testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
    testing::internal::AssertHelper::~AssertHelper(&local_c90);
    std::__cxx11::string::~string((string *)&local_cb0);
    testing::Message::~Message((Message *)0x1cf926);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cf9a1);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_cc1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cf9ef)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_cc0);
  if (!bVar8) {
    testing::Message::Message(&local_cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cf8,(internal *)&local_cc0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x16a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_cd8,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_cd8);
    std::__cxx11::string::~string((string *)&local_cf8);
    testing::Message::~Message((Message *)0x1cfaed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cfb68);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_e70);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_e78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x16c,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message((Message *)0x1cfcc3);
  }
  local_e91 = cfd::AddressFactory::CheckAddressNetType
                        (this_00,(Address *)
                                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                         CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                         NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cfd57)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_e90);
  if (!bVar8) {
    testing::Message::Message(&local_ea0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ec8,(internal *)&local_e90,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x16d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_ea8,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_ea8);
    std::__cxx11::string::~string((string *)&local_ec8);
    testing::Message::~Message((Message *)0x1cfe43);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cfebe);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_ed9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1cff0c)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_ed8);
  if (!bVar8) {
    testing::Message::Message(&local_ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f10,(internal *)&local_ed8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x16e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_ef0,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper(&local_ef0);
    std::__cxx11::string::~string((string *)&local_f10);
    testing::Message::~Message((Message *)0x1d000a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d0085);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_f21 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d00d3)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_f20);
  if (!bVar8) {
    testing::Message::Message(&local_f30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f58,(internal *)&local_f20,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x16f,pcVar15);
    testing::internal::AssertHelper::operator=(&local_f38,&local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    std::__cxx11::string::~string((string *)&local_f58);
    testing::Message::~Message((Message *)0x1d01d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d024c);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_f69 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d029a)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_f68);
  if (!bVar8) {
    testing::Message::Message(&local_f78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fa0,(internal *)&local_f68,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x170,pcVar15);
    testing::internal::AssertHelper::operator=(&local_f80,&local_f78);
    testing::internal::AssertHelper::~AssertHelper(&local_f80);
    std::__cxx11::string::~string((string *)&local_fa0);
    testing::Message::~Message((Message *)0x1d0398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d0413);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_fb1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d0461)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_fb0);
  if (!bVar8) {
    testing::Message::Message(&local_fc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fe8,(internal *)&local_fb0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x171,pcVar15);
    testing::internal::AssertHelper::operator=(&local_fc8,&local_fc0);
    testing::internal::AssertHelper::~AssertHelper(&local_fc8);
    std::__cxx11::string::~string((string *)&local_fe8);
    testing::Message::~Message((Message *)0x1d055f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d05da);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_ff9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d0628)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_ff8);
  if (!bVar8) {
    testing::Message::Message(&local_1008);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1030,(internal *)&local_ff8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1010,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x172,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1010,&local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1010);
    std::__cxx11::string::~string((string *)&local_1030);
    testing::Message::~Message((Message *)0x1d0726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d07a1);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1041 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d07ef)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1040);
  if (!bVar8) {
    testing::Message::Message(&local_1050);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1078,(internal *)&local_1040,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x173,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1058,&local_1050);
    testing::internal::AssertHelper::~AssertHelper(&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    testing::Message::~Message((Message *)0x1d08ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d0968);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             in_stack_ffffffffffffd22c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1d0991);
  cfd::AddressFactory::operator=
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (AddressFactory *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1d09b7);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffd247,
                      CONCAT16(in_stack_ffffffffffffd246,
                               CONCAT15(in_stack_ffffffffffffd245,
                                        CONCAT14(in_stack_ffffffffffffd244,
                                                 CONCAT13(in_stack_ffffffffffffd243,
                                                          CONCAT12(in_stack_ffffffffffffd242,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd241,
                                                  in_stack_ffffffffffffd240))))))));
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_1230);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_1238);
    testing::internal::AssertHelper::AssertHelper
              (&local_1240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x176,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1240,&local_1238);
    testing::internal::AssertHelper::~AssertHelper(&local_1240);
    testing::Message::~Message((Message *)0x1d0b6b);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1251 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d0c01)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1250);
  if (!bVar8) {
    testing::Message::Message(&local_1260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1288,(internal *)&local_1250,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x177,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1268,&local_1260);
    testing::internal::AssertHelper::~AssertHelper(&local_1268);
    std::__cxx11::string::~string((string *)&local_1288);
    testing::Message::~Message((Message *)0x1d0ced);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d0d68);
  local_1299 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d0db4)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1298);
  if (!bVar8) {
    testing::Message::Message(&local_12a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_12d0,(internal *)&local_1298,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x178,pcVar15);
    testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
    testing::internal::AssertHelper::~AssertHelper(&local_12b0);
    std::__cxx11::string::~string((string *)&local_12d0);
    testing::Message::~Message((Message *)0x1d0eb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d0f2d);
  local_12e1 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d0f79)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_12e0);
  if (!bVar8) {
    testing::Message::Message(&local_12f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1318,(internal *)&local_12e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x179,pcVar15);
    testing::internal::AssertHelper::operator=(&local_12f8,&local_12f0);
    testing::internal::AssertHelper::~AssertHelper(&local_12f8);
    std::__cxx11::string::~string((string *)&local_1318);
    testing::Message::~Message((Message *)0x1d1077);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d10ef);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1329 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d1137)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1328);
  if (!bVar8) {
    testing::Message::Message(&local_1338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1360,(internal *)&local_1328,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x17a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1340,&local_1338);
    testing::internal::AssertHelper::~AssertHelper(&local_1340);
    std::__cxx11::string::~string((string *)&local_1360);
    testing::Message::~Message((Message *)0x1d122f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d12a7);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1371 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d12ef)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1370);
  if (!bVar8) {
    testing::Message::Message(&local_1380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13a8,(internal *)&local_1370,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x17b,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1388,&local_1380);
    testing::internal::AssertHelper::~AssertHelper(&local_1388);
    std::__cxx11::string::~string((string *)&local_13a8);
    testing::Message::~Message((Message *)0x1d13e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d145f);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_13b9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d14a7)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_13b8);
  if (!bVar8) {
    testing::Message::Message(&local_13c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13f0,(internal *)&local_13b8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x17c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    std::__cxx11::string::~string((string *)&local_13f0);
    testing::Message::~Message((Message *)0x1d159f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1617);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1401 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d165f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1400);
  if (!bVar8) {
    testing::Message::Message(&local_1410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1438,(internal *)&local_1400,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x17d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1418,&local_1410);
    testing::internal::AssertHelper::~AssertHelper(&local_1418);
    std::__cxx11::string::~string((string *)&local_1438);
    testing::Message::~Message((Message *)0x1d1757);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d17d2);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_15b0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_15b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_15c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x17f,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_15c0,&local_15b8);
    testing::internal::AssertHelper::~AssertHelper(&local_15c0);
    testing::Message::~Message((Message *)0x1d1921);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_15d1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d19b1)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_15d0);
  if (!bVar8) {
    testing::Message::Message(&local_15e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1608,(internal *)&local_15d0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_15e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x180,pcVar15);
    testing::internal::AssertHelper::operator=(&local_15e8,&local_15e0);
    testing::internal::AssertHelper::~AssertHelper(&local_15e8);
    std::__cxx11::string::~string((string *)&local_1608);
    testing::Message::~Message((Message *)0x1d1a97);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1b0f);
  local_1619 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d1b55)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1618);
  if (!bVar8) {
    testing::Message::Message(&local_1628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1650,(internal *)&local_1618,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x181,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1630,&local_1628);
    testing::internal::AssertHelper::~AssertHelper(&local_1630);
    std::__cxx11::string::~string((string *)&local_1650);
    testing::Message::~Message((Message *)0x1d1c4d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1cc5);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1661 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d1d0d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1660);
  if (!bVar8) {
    testing::Message::Message(&local_1670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1698,(internal *)&local_1660,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x182,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1678,&local_1670);
    testing::internal::AssertHelper::~AssertHelper(&local_1678);
    std::__cxx11::string::~string((string *)&local_1698);
    testing::Message::~Message((Message *)0x1d1e05);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1e7d);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_16a9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d1ec5)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_16a8);
  if (!bVar8) {
    testing::Message::Message(&local_16b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16e0,(internal *)&local_16a8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x183,pcVar15);
    testing::internal::AssertHelper::operator=(&local_16c0,&local_16b8);
    testing::internal::AssertHelper::~AssertHelper(&local_16c0);
    std::__cxx11::string::~string((string *)&local_16e0);
    testing::Message::~Message((Message *)0x1d1fbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2035);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_16f1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d207d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_16f0);
  if (!bVar8) {
    testing::Message::Message(&local_1700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1728,(internal *)&local_16f0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x184,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1708,&local_1700);
    testing::internal::AssertHelper::~AssertHelper(&local_1708);
    std::__cxx11::string::~string((string *)&local_1728);
    testing::Message::~Message((Message *)0x1d2175);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d21ed);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1739 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d2235)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1738);
  if (!bVar8) {
    testing::Message::Message(&local_1748);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1770,(internal *)&local_1738,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x185,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1750,&local_1748);
    testing::internal::AssertHelper::~AssertHelper(&local_1750);
    std::__cxx11::string::~string((string *)&local_1770);
    testing::Message::~Message((Message *)0x1d232d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d23a5);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1781 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d23ed)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1780);
  if (!bVar8) {
    testing::Message::Message(&local_1790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17b8,(internal *)&local_1780,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x186,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1798,&local_1790);
    testing::internal::AssertHelper::~AssertHelper(&local_1798);
    std::__cxx11::string::~string((string *)&local_17b8);
    testing::Message::~Message((Message *)0x1d24e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2560);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_1930);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_1938);
    testing::internal::AssertHelper::AssertHelper
              (&local_1940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x188,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1940,&local_1938);
    testing::internal::AssertHelper::~AssertHelper(&local_1940);
    testing::Message::~Message((Message *)0x1d26af);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1951 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d273f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1950);
  if (!bVar8) {
    testing::Message::Message(&local_1960);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1988,(internal *)&local_1950,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x189,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1968,&local_1960);
    testing::internal::AssertHelper::~AssertHelper(&local_1968);
    std::__cxx11::string::~string((string *)&local_1988);
    testing::Message::~Message((Message *)0x1d2825);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d289d);
  local_1999 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d28e3)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1998);
  if (!bVar8) {
    testing::Message::Message(&local_19a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_19d0,(internal *)&local_1998,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x18a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_19b0,&local_19a8);
    testing::internal::AssertHelper::~AssertHelper(&local_19b0);
    std::__cxx11::string::~string((string *)&local_19d0);
    testing::Message::~Message((Message *)0x1d29db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2a53);
  local_19e1 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d2a99)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_19e0);
  if (!bVar8) {
    testing::Message::Message(&local_19f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a18,(internal *)&local_19e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x18b,pcVar15);
    testing::internal::AssertHelper::operator=(&local_19f8,&local_19f0);
    testing::internal::AssertHelper::~AssertHelper(&local_19f8);
    std::__cxx11::string::~string((string *)&local_1a18);
    testing::Message::~Message((Message *)0x1d2b91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2c09);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1a29 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d2c51)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1a28);
  if (!bVar8) {
    testing::Message::Message(&local_1a38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a60,(internal *)&local_1a28,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x18c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1a40,&local_1a38);
    testing::internal::AssertHelper::~AssertHelper(&local_1a40);
    std::__cxx11::string::~string((string *)&local_1a60);
    testing::Message::~Message((Message *)0x1d2d49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2dc1);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1a71 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d2e09)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1a70);
  if (!bVar8) {
    testing::Message::Message(&local_1a80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1aa8,(internal *)&local_1a70,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x18d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1a88,&local_1a80);
    testing::internal::AssertHelper::~AssertHelper(&local_1a88);
    std::__cxx11::string::~string((string *)&local_1aa8);
    testing::Message::~Message((Message *)0x1d2f01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d2f79);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1ab9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d2fc1)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1ab8);
  if (!bVar8) {
    testing::Message::Message(&local_1ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1af0,(internal *)&local_1ab8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x18e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1ad0,&local_1ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ad0);
    std::__cxx11::string::~string((string *)&local_1af0);
    testing::Message::~Message((Message *)0x1d30b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3131);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1b01 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d3179)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1b00);
  if (!bVar8) {
    testing::Message::Message(&local_1b10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b38,(internal *)&local_1b00,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,399,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1b18,&local_1b10);
    testing::internal::AssertHelper::~AssertHelper(&local_1b18);
    std::__cxx11::string::~string((string *)&local_1b38);
    testing::Message::~Message((Message *)0x1d3271);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d32ec);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_1cb0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_1cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x191,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1cc0,&local_1cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cc0);
    testing::Message::~Message((Message *)0x1d343b);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1cd1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d34cb)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1cd0);
  if (!bVar8) {
    testing::Message::Message(&local_1ce0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d08,(internal *)&local_1cd0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x192,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1ce8,&local_1ce0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ce8);
    std::__cxx11::string::~string((string *)&local_1d08);
    testing::Message::~Message((Message *)0x1d35b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3629);
  local_1d19 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d366f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1d18);
  if (!bVar8) {
    testing::Message::Message(&local_1d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d50,(internal *)&local_1d18,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x193,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1d30,&local_1d28);
    testing::internal::AssertHelper::~AssertHelper(&local_1d30);
    std::__cxx11::string::~string((string *)&local_1d50);
    testing::Message::~Message((Message *)0x1d3767);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d37df);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1d61 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d3827)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1d60);
  if (!bVar8) {
    testing::Message::Message(&local_1d70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d98,(internal *)&local_1d60,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x194,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1d78,&local_1d70);
    testing::internal::AssertHelper::~AssertHelper(&local_1d78);
    std::__cxx11::string::~string((string *)&local_1d98);
    testing::Message::~Message((Message *)0x1d391f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3997);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1da9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d39df)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1da8);
  if (!bVar8) {
    testing::Message::Message(&local_1db8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1de0,(internal *)&local_1da8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x195,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1dc0,&local_1db8);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc0);
    std::__cxx11::string::~string((string *)&local_1de0);
    testing::Message::~Message((Message *)0x1d3ad7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3b4f);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1df1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d3b97)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1df0);
  if (!bVar8) {
    testing::Message::Message(&local_1e00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e28,(internal *)&local_1df0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x196,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e08,&local_1e00);
    testing::internal::AssertHelper::~AssertHelper(&local_1e08);
    std::__cxx11::string::~string((string *)&local_1e28);
    testing::Message::~Message((Message *)0x1d3c8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3d07);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1e39 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d3d4f)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1e38);
  if (!bVar8) {
    testing::Message::Message(&local_1e48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e70,(internal *)&local_1e38,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x197,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e50,&local_1e48);
    testing::internal::AssertHelper::~AssertHelper(&local_1e50);
    std::__cxx11::string::~string((string *)&local_1e70);
    testing::Message::~Message((Message *)0x1d3e47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3ebf);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_1e81 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d3f07)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_1e80);
  if (!bVar8) {
    testing::Message::Message(&local_1e90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1eb8,(internal *)&local_1e80,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x198,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e98,&local_1e90);
    testing::internal::AssertHelper::~AssertHelper(&local_1e98);
    std::__cxx11::string::~string((string *)&local_1eb8);
    testing::Message::~Message((Message *)0x1d3fff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d407a);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             in_stack_ffffffffffffd22c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1d40a3);
  cfd::AddressFactory::operator=
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (AddressFactory *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1d40c9);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffd247,
                      CONCAT16(in_stack_ffffffffffffd246,
                               CONCAT15(in_stack_ffffffffffffd245,
                                        CONCAT14(in_stack_ffffffffffffd244,
                                                 CONCAT13(in_stack_ffffffffffffd243,
                                                          CONCAT12(in_stack_ffffffffffffd242,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd241,
                                                  in_stack_ffffffffffffd240))))))));
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_2070);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_2078);
    testing::internal::AssertHelper::AssertHelper
              (&local_2080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x19b,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2080,&local_2078);
    testing::internal::AssertHelper::~AssertHelper(&local_2080);
    testing::Message::~Message((Message *)0x1d4271);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2091 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d4301)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2090);
  if (!bVar8) {
    testing::Message::Message(&local_20a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_20c8,(internal *)&local_2090,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_20a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x19c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_20a8,&local_20a0);
    testing::internal::AssertHelper::~AssertHelper(&local_20a8);
    std::__cxx11::string::~string((string *)&local_20c8);
    testing::Message::~Message((Message *)0x1d43e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d445f);
  local_20d9 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d44a5)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_20d8);
  if (!bVar8) {
    testing::Message::Message(&local_20e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2110,(internal *)&local_20d8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_20f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x19d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_20f0,&local_20e8);
    testing::internal::AssertHelper::~AssertHelper(&local_20f0);
    std::__cxx11::string::~string((string *)&local_2110);
    testing::Message::~Message((Message *)0x1d459d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4615);
  local_2121 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d465b)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2120);
  if (!bVar8) {
    testing::Message::Message(&local_2130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2158,(internal *)&local_2120,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x19e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2138,&local_2130);
    testing::internal::AssertHelper::~AssertHelper(&local_2138);
    std::__cxx11::string::~string((string *)&local_2158);
    testing::Message::~Message((Message *)0x1d4753);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d47cb);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2169 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d4813)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2168);
  if (!bVar8) {
    testing::Message::Message(&local_2178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_21a0,(internal *)&local_2168,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x19f,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2180,&local_2178);
    testing::internal::AssertHelper::~AssertHelper(&local_2180);
    std::__cxx11::string::~string((string *)&local_21a0);
    testing::Message::~Message((Message *)0x1d490b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4983);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_21b1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d49cb)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_21b0);
  if (!bVar8) {
    testing::Message::Message(&local_21c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_21e8,(internal *)&local_21b0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_21c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a0,pcVar15);
    testing::internal::AssertHelper::operator=(&local_21c8,&local_21c0);
    testing::internal::AssertHelper::~AssertHelper(&local_21c8);
    std::__cxx11::string::~string((string *)&local_21e8);
    testing::Message::~Message((Message *)0x1d4ac3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4b3b);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_21f9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d4b83)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_21f8);
  if (!bVar8) {
    testing::Message::Message(&local_2208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2230,(internal *)&local_21f8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a1,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2210,&local_2208);
    testing::internal::AssertHelper::~AssertHelper(&local_2210);
    std::__cxx11::string::~string((string *)&local_2230);
    testing::Message::~Message((Message *)0x1d4c7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4cf3);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2241 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d4d3b)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2240);
  if (!bVar8) {
    testing::Message::Message(&local_2250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2278,(internal *)&local_2240,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a2,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2258,&local_2250);
    testing::internal::AssertHelper::~AssertHelper(&local_2258);
    std::__cxx11::string::~string((string *)&local_2278);
    testing::Message::~Message((Message *)0x1d4e33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4eae);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_23f0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_23f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a4,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2400,&local_23f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2400);
    testing::Message::~Message((Message *)0x1d4ffd);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2411 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d508d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2410);
  if (!bVar8) {
    testing::Message::Message(&local_2420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2448,(internal *)&local_2410,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a5,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2428,&local_2420);
    testing::internal::AssertHelper::~AssertHelper(&local_2428);
    std::__cxx11::string::~string((string *)&local_2448);
    testing::Message::~Message((Message *)0x1d5173);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d51eb);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2459 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5233)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2458);
  if (!bVar8) {
    testing::Message::Message(&local_2468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2490,(internal *)&local_2458,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a6,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2470,&local_2468);
    testing::internal::AssertHelper::~AssertHelper(&local_2470);
    std::__cxx11::string::~string((string *)&local_2490);
    testing::Message::~Message((Message *)0x1d532b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d53a3);
  local_24a1 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d53e9)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_24a0);
  if (!bVar8) {
    testing::Message::Message(&local_24b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_24d8,(internal *)&local_24a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_24b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a7,pcVar15);
    testing::internal::AssertHelper::operator=(&local_24b8,&local_24b0);
    testing::internal::AssertHelper::~AssertHelper(&local_24b8);
    std::__cxx11::string::~string((string *)&local_24d8);
    testing::Message::~Message((Message *)0x1d54e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5559);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_24e9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d55a1)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_24e8);
  if (!bVar8) {
    testing::Message::Message(&local_24f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2520,(internal *)&local_24e8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a8,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2500,&local_24f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2500);
    std::__cxx11::string::~string((string *)&local_2520);
    testing::Message::~Message((Message *)0x1d5699);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5711);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2531 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5759)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2530);
  if (!bVar8) {
    testing::Message::Message(&local_2540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2568,(internal *)&local_2530,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1a9,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2548,&local_2540);
    testing::internal::AssertHelper::~AssertHelper(&local_2548);
    std::__cxx11::string::~string((string *)&local_2568);
    testing::Message::~Message((Message *)0x1d5851);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d58c9);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2579 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5911)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2578);
  if (!bVar8) {
    testing::Message::Message(&local_2588);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_25b0,(internal *)&local_2578,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1aa,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2590,&local_2588);
    testing::internal::AssertHelper::~AssertHelper(&local_2590);
    std::__cxx11::string::~string((string *)&local_25b0);
    testing::Message::~Message((Message *)0x1d5a09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5a81);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_25c1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5ac9)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_25c0);
  if (!bVar8) {
    testing::Message::Message(&local_25d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_25f8,(internal *)&local_25c0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_25d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ab,pcVar15);
    testing::internal::AssertHelper::operator=(&local_25d8,&local_25d0);
    testing::internal::AssertHelper::~AssertHelper(&local_25d8);
    std::__cxx11::string::~string((string *)&local_25f8);
    testing::Message::~Message((Message *)0x1d5bc1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5c3c);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffd23f,
                          CONCAT16(in_stack_ffffffffffffd23e,
                                   CONCAT15(in_stack_ffffffffffffd23d,
                                            CONCAT14(in_stack_ffffffffffffd23c,
                                                     CONCAT13(in_stack_ffffffffffffd23b,
                                                              CONCAT12(in_stack_ffffffffffffd23a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd239,
                                                  in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_2770);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_2778);
    testing::internal::AssertHelper::AssertHelper
              (&local_2780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ad,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2780,&local_2778);
    testing::internal::AssertHelper::~AssertHelper(&local_2780);
    testing::Message::~Message((Message *)0x1d5d8b);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2791 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5e1b)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2790);
  if (!bVar8) {
    testing::Message::Message(&local_27a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_27c8,(internal *)&local_2790,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_27a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ae,pcVar15);
    testing::internal::AssertHelper::operator=(&local_27a8,&local_27a0);
    testing::internal::AssertHelper::~AssertHelper(&local_27a8);
    std::__cxx11::string::~string((string *)&local_27c8);
    testing::Message::~Message((Message *)0x1d5f01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5f79);
  local_27d9 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d5fbf)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_27d8);
  if (!bVar8) {
    testing::Message::Message(&local_27e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2810,(internal *)&local_27d8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_27f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1af,pcVar15);
    testing::internal::AssertHelper::operator=(&local_27f0,&local_27e8);
    testing::internal::AssertHelper::~AssertHelper(&local_27f0);
    std::__cxx11::string::~string((string *)&local_2810);
    testing::Message::~Message((Message *)0x1d60b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d612f);
  local_2821 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d6175)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2820);
  if (!bVar8) {
    testing::Message::Message(&local_2830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2858,(internal *)&local_2820,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b0,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2838,&local_2830);
    testing::internal::AssertHelper::~AssertHelper(&local_2838);
    std::__cxx11::string::~string((string *)&local_2858);
    testing::Message::~Message((Message *)0x1d626d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d62e5);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2869 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d632d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2868);
  if (!bVar8) {
    testing::Message::Message(&local_2878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28a0,(internal *)&local_2868,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b1,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2880,&local_2878);
    testing::internal::AssertHelper::~AssertHelper(&local_2880);
    std::__cxx11::string::~string((string *)&local_28a0);
    testing::Message::~Message((Message *)0x1d6425);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d649d);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_28b1 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d64e5)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_28b0);
  if (!bVar8) {
    testing::Message::Message(&local_28c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28e8,(internal *)&local_28b0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_28c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b2,pcVar15);
    testing::internal::AssertHelper::operator=(&local_28c8,&local_28c0);
    testing::internal::AssertHelper::~AssertHelper(&local_28c8);
    std::__cxx11::string::~string((string *)&local_28e8);
    testing::Message::~Message((Message *)0x1d65dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6655);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_28f9 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d669d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_28f8);
  if (!bVar8) {
    testing::Message::Message(&local_2908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2930,(internal *)&local_28f8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b3,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2910,&local_2908);
    testing::internal::AssertHelper::~AssertHelper(&local_2910);
    std::__cxx11::string::~string((string *)&local_2930);
    testing::Message::~Message((Message *)0x1d6795);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d680d);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2941 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d6855)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2940);
  if (!bVar8) {
    testing::Message::Message(&local_2950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2978,(internal *)&local_2940,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b4,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2958,&local_2950);
    testing::internal::AssertHelper::~AssertHelper(&local_2958);
    std::__cxx11::string::~string((string *)&local_2978);
    testing::Message::~Message((Message *)0x1d694d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d69c8);
  uVar9 = testing::internal::AlwaysTrue();
  if ((bool)uVar9) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(uVar9,CONCAT16(bVar8,CONCAT15(in_stack_ffffffffffffd23d,
                                                        CONCAT14(in_stack_ffffffffffffd23c,
                                                                 CONCAT13(in_stack_ffffffffffffd23b,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffd23a,
                                                  CONCAT11(in_stack_ffffffffffffd239,
                                                           in_stack_ffffffffffffd238))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
      cfd::core::Address::operator=(&local_210,&local_2af0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffd237,
                          CONCAT16(in_stack_ffffffffffffd236,
                                   CONCAT15(in_stack_ffffffffffffd235,
                                            CONCAT14(in_stack_ffffffffffffd234,
                                                     CONCAT13(in_stack_ffffffffffffd233,
                                                              CONCAT12(in_stack_ffffffffffffd232,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))));
    }
  }
  else {
    testing::Message::Message(&local_2af8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b6,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2b00,&local_2af8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b00);
    testing::Message::~Message((Message *)0x1d6b17);
  }
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2b11 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d6ba7)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2b10);
  if (!bVar8) {
    testing::Message::Message(&local_2b20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2b48,(internal *)&local_2b10,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b7,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2b28,&local_2b20);
    testing::internal::AssertHelper::~AssertHelper(&local_2b28);
    std::__cxx11::string::~string((string *)&local_2b48);
    testing::Message::~Message((Message *)0x1d6c8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6d05);
  bVar8 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2b59 = ~bVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d6d4d)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2b58);
  if (!bVar8) {
    testing::Message::Message(&local_2b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2b90,(internal *)&local_2b58,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b8,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2b70,&local_2b68);
    testing::internal::AssertHelper::~AssertHelper(&local_2b70);
    std::__cxx11::string::~string((string *)&local_2b90);
    testing::Message::~Message((Message *)0x1d6e45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6ebd);
  local_2ba1 = cfd::AddressFactory::CheckAddressNetType
                         (this_00,(Address *)
                                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                          CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(
                                                  uVar4,CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),
                          NVar17);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffd237,
                      CONCAT16(in_stack_ffffffffffffd236,
                               CONCAT15(in_stack_ffffffffffffd235,
                                        CONCAT14(in_stack_ffffffffffffd234,
                                                 CONCAT13(in_stack_ffffffffffffd233,
                                                          CONCAT12(in_stack_ffffffffffffd232,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d6f03)
  ;
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_2ba0);
  if (!bVar8) {
    testing::Message::Message(&local_2bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2bd8,(internal *)&local_2ba0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1b9,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2bb8,&local_2bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_2bb8);
    std::__cxx11::string::~string((string *)&local_2bd8);
    testing::Message::~Message((Message *)0x1d6ffb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d7073);
  uVar9 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2be9 = ~uVar9 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffd236,
                                     CONCAT15(in_stack_ffffffffffffd235,
                                              CONCAT14(in_stack_ffffffffffffd234,
                                                       CONCAT13(in_stack_ffffffffffffd233,
                                                                CONCAT12(in_stack_ffffffffffffd232,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffd231,
                                                  in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d70bb)
  ;
  uVar10 = testing::AssertionResult::operator_cast_to_bool(&local_2be8);
  if (!(bool)uVar10) {
    testing::Message::Message(&local_2bf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c20,(internal *)&local_2be8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ba,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2c00,&local_2bf8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c00);
    std::__cxx11::string::~string((string *)&local_2c20);
    testing::Message::~Message((Message *)0x1d71b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d722b);
  uVar11 = cfd::AddressFactory::CheckAddressNetType
                     (this_00,(Address *)
                              CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2c31 = ~uVar11 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(in_stack_ffffffffffffd234,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffd233,
                                                  CONCAT12(in_stack_ffffffffffffd232,
                                                           CONCAT11(in_stack_ffffffffffffd231,
                                                                    in_stack_ffffffffffffd230)))))))
             ,(bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d7273
            );
  uVar12 = testing::AssertionResult::operator_cast_to_bool(&local_2c30);
  if (!(bool)uVar12) {
    testing::Message::Message(&local_2c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c68,(internal *)&local_2c30,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1bb,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2c48,&local_2c40);
    testing::internal::AssertHelper::~AssertHelper(&local_2c48);
    std::__cxx11::string::~string((string *)&local_2c68);
    testing::Message::~Message((Message *)0x1d736b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d73e3);
  uVar13 = cfd::AddressFactory::CheckAddressNetType
                     (this_00,(Address *)
                              CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2c79 = ~uVar13 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12
                                                  (in_stack_ffffffffffffd232,
                                                   CONCAT11(in_stack_ffffffffffffd231,
                                                            in_stack_ffffffffffffd230))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d742b)
  ;
  uVar14 = testing::AssertionResult::operator_cast_to_bool(&local_2c78);
  if (!(bool)uVar14) {
    testing::Message::Message(&local_2c88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2cb0,(internal *)&local_2c78,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1bc,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2c90,&local_2c88);
    testing::internal::AssertHelper::~AssertHelper(&local_2c90);
    std::__cxx11::string::~string((string *)&local_2cb0);
    testing::Message::~Message((Message *)0x1d7523);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d759b);
  uVar1 = cfd::AddressFactory::CheckAddressNetType
                    (this_00,(Address *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffd2f6,
                                                     CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,CONCAT11(uVar6,uVar7))))))),NVar17)
  ;
  local_2cc1 = ~uVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12
                                                  (uVar14,CONCAT11(uVar1,in_stack_ffffffffffffd230))
                                                  ))))),
             (bool *)CONCAT44(in_stack_ffffffffffffd22c,in_stack_ffffffffffffd228),(type *)0x1d75e3)
  ;
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2cc0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_2cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2cf8,(internal *)&local_2cc0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1bd,pcVar15);
    testing::internal::AssertHelper::operator=(&local_2cd8,&local_2cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_2cd8);
    std::__cxx11::string::~string((string *)&local_2cf8);
    testing::Message::~Message((Message *)0x1d76db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d7753);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12
                                                  (uVar14,CONCAT11(uVar1,uVar2))))))));
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,CONCAT12
                                                  (uVar14,CONCAT11(uVar1,uVar2))))))));
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1d777a);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1d7787);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_bitcoin)
{
  AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kTestnet, GetBitcoinAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kRegtest, GetBitcoinAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}